

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  ulong uVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  
  puVar3 = *p;
  iVar5 = -0x6c;
  if (start <= puVar3) {
    uVar1 = bits + 7;
    uVar6 = uVar1 >> 3;
    if (uVar6 < (ulong)((long)puVar3 - (long)start)) {
      bVar7 = ((byte)uVar1 & 0xf8) - (char)bits;
      if (7 < uVar1) {
        bVar2 = buf[uVar6 - 1];
        *p = puVar3 + -1;
        puVar3[-1] = (byte)(-1 << (bVar7 & 0x1f)) & bVar2;
        puVar3 = *p;
        *p = puVar3 + (1 - uVar6);
        memcpy(puVar3 + (1 - uVar6),buf,uVar6 - 1);
      }
      puVar3 = *p;
      *p = puVar3 + -1;
      puVar3[-1] = bVar7;
      iVar4 = mbedtls_asn1_write_len(p,start,uVar6 + 1);
      iVar5 = iVar4;
      if (-1 < iVar4) {
        puVar3 = *p;
        if ((long)puVar3 - (long)start < 1) {
          iVar5 = -0x6c;
        }
        else {
          *p = puVar3 + -1;
          puVar3[-1] = '\x03';
          iVar5 = 1;
        }
        if (puVar3 != start && -1 < (long)puVar3 - (long)start) {
          iVar5 = iVar4 + (int)(uVar6 + 1) + iVar5;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_asn1_write_bitstring( unsigned char **p, unsigned char *start,
                          const unsigned char *buf, size_t bits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = ( bits + 7 ) / 8;
    unused_bits = ( byte_len * 8 ) - bits;

    if( *p < start || (size_t)( *p - start ) < byte_len + 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if( byte_len > 0 )
    {
        byte_len--;
        *--( *p ) = buf[byte_len] & ~( ( 0x1 << unused_bits ) - 1 );
        ( *p ) -= byte_len;
        memcpy( *p, buf, byte_len );
    }

    /* Write unused bits */
    *--( *p ) = (unsigned char)unused_bits;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    return( (int) len );
}